

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall
Psbt_SetGlobalRecordTest_Test::Psbt_SetGlobalRecordTest_Test(Psbt_SetGlobalRecordTest_Test *this)

{
  Psbt_SetGlobalRecordTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Psbt_SetGlobalRecordTest_Test_00887b40;
  return;
}

Assistant:

TEST(Psbt, SetGlobalRecordTest) {
  Transaction tx("0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000");
  Psbt psbt(tx);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetGlobalRecord(global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key1));
  EXPECT_FALSE(psbt.IsFindGlobalRecord(global_key2));
  psbt.SetGlobalRecord(global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key2));

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_gval1 = psbt2.GetGlobalRecord(global_key1);
  auto get_gval2 = psbt2.GetGlobalRecord(global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetGlobalRecordKeyList();
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }

  ByteData global_tx_key = Psbt::CreateRecordKey(Psbt::kPsbtGlobalUnsignedTx);
  EXPECT_STREQ(
      "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000",
      psbt2.GetGlobalRecord(global_tx_key).GetHex().c_str());
}